

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_unitEquivalenceBasicDimensionlessUnits_Test::
~Validator_unitEquivalenceBasicDimensionlessUnits_Test
          (Validator_unitEquivalenceBasicDimensionlessUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unitEquivalenceBasicDimensionlessUnits)
{
    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    v1->setName("tomayto");
    v1->setInterfaceType("public");
    v2->setName("tomahto");
    v2->setInterfaceType("public");

    m->setName("callthewholethingoff");
    comp1->addVariable(v1);
    comp2->addVariable(v2);
    comp1->setName("comp1");
    comp2->setName("comp2");
    m->addComponent(comp1);
    m->addComponent(comp2);

    // u1 = u2: testing that cancelled units become dimensionless.
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("metrepermetre");
    u1->addUnit("metre");
    u1->addUnit("metre", -1.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("ratio");
    u2->addUnit("dimensionless");

    v1->setUnits(u1);
    v2->setUnits(u2);

    m->addUnits(u1);
    m->addUnits(u2);

    libcellml::Variable::addEquivalence(v1, v2);

    validator->validateModel(m);
    EXPECT_EQ(size_t(0), validator->issueCount());
}